

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O3

void __thiscall argparse::args_t::~args_t(args_t *this)

{
  FILE *pFVar1;
  
  pFVar1 = (FILE *)this->output;
  if ((pFVar1 != (FILE *)0x0) && (pFVar1 != _stdout)) {
    fclose(pFVar1);
  }
  pFVar1 = (FILE *)this->input;
  if ((pFVar1 != (FILE *)0x0) && (pFVar1 != _stdin)) {
    fclose(pFVar1);
  }
  if (this->motif_list != (char *)0x0) {
    free(this->motif_list);
    return;
  }
  return;
}

Assistant:

args_t::~args_t() {
        if ( output && output != stdout )
            fclose( output );
        
        if ( input && input != stdin)
            fclose ( input );
        
        if ( motif_list )
            free ( motif_list );
    }